

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O0

void soplex::
     SPxQuicksort<soplex::SPxBoundFlippingRT<double>::Breakpoint,soplex::SPxBoundFlippingRT<double>::BreakpointCompare>
               (Breakpoint *keys,int end,BreakpointCompare *compare,int start,bool type)

{
  Breakpoint *pBVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  Breakpoint i;
  Breakpoint j;
  Breakpoint i_00;
  Breakpoint j_00;
  Breakpoint j_01;
  Breakpoint j_02;
  Breakpoint j_03;
  int iVar5;
  double *pdVar6;
  undefined1 (*pauVar7) [12];
  undefined8 *puVar8;
  int in_ECX;
  undefined8 *puVar9;
  BreakpointCompare *in_RDX;
  int in_ESI;
  long in_RDI;
  undefined1 in_R8B;
  double dVar10;
  int mid;
  int hi;
  int lo;
  Breakpoint tmp;
  Breakpoint pivotkey;
  BreakpointSource in_stack_ffffffffffffff1c;
  Breakpoint *in_stack_ffffffffffffff20;
  undefined4 local_d8;
  BreakpointSource in_stack_ffffffffffffff2c;
  Breakpoint *in_stack_ffffffffffffff30;
  int local_48;
  int local_44;
  bool bVar12;
  double dVar11;
  undefined3 in_stack_ffffffffffffffe0;
  uint uVar13;
  int iVar14;
  int end_00;
  undefined4 in_stack_fffffffffffffff0;
  int iVar15;
  
  uVar13 = CONCAT13(in_R8B,in_stack_ffffffffffffffe0);
  if (in_ECX + 1 < in_ESI) {
    local_48 = in_ESI + -1;
    local_44 = in_ECX;
    while (uVar13 = uVar13 & 0x1ffffff, 0x18 < local_48 - local_44) {
      iVar5 = local_44 + (local_48 - local_44) / 2;
      pdVar6 = (double *)(in_RDI + (long)iVar5 * 0x10);
      pBVar1 = (Breakpoint *)*pdVar6;
      dVar11 = pdVar6[1];
      iVar14 = local_44;
      iVar15 = local_48;
      while( true ) {
        if ((uVar13 & 0x1000000) == 0) {
          while( true ) {
            bVar12 = false;
            if (local_44 < iVar15) {
              j_01._8_8_ = dVar11;
              j_01.val = (double)pBVar1;
              dVar10 = SPxBoundFlippingRT<double>::BreakpointCompare::operator()
                                 (in_RDX,*(Breakpoint *)(in_RDI + (long)local_44 * 0x10),j_01);
              bVar12 = dVar10 <= 0.0;
            }
            if (!bVar12) break;
            local_44 = local_44 + 1;
          }
          while( true ) {
            bVar12 = false;
            if (iVar14 < local_48) {
              j_00._8_8_ = dVar11;
              j_00.val = (double)pBVar1;
              in_stack_ffffffffffffff30 = pBVar1;
              dVar10 = SPxBoundFlippingRT<double>::BreakpointCompare::operator()
                                 (in_RDX,*(Breakpoint *)(in_RDI + (long)local_48 * 0x10),j_00);
              bVar12 = 0.0 < dVar10;
            }
            if (!bVar12) break;
            local_48 = local_48 + -1;
          }
        }
        else {
          while( true ) {
            bVar12 = false;
            if (local_44 < iVar15) {
              j_03._8_8_ = dVar11;
              j_03.val = (double)pBVar1;
              dVar10 = SPxBoundFlippingRT<double>::BreakpointCompare::operator()
                                 (in_RDX,*(Breakpoint *)(in_RDI + (long)local_44 * 0x10),j_03);
              bVar12 = dVar10 < 0.0;
            }
            if (!bVar12) break;
            local_44 = local_44 + 1;
          }
          while( true ) {
            bVar12 = false;
            if (iVar14 < local_48) {
              j_02._8_8_ = dVar11;
              j_02.val = (double)pBVar1;
              dVar10 = SPxBoundFlippingRT<double>::BreakpointCompare::operator()
                                 (in_RDX,*(Breakpoint *)(in_RDI + (long)local_48 * 0x10),j_02);
              bVar12 = 0.0 <= dVar10;
            }
            if (!bVar12) break;
            local_48 = local_48 + -1;
          }
        }
        if (local_48 <= local_44) break;
        puVar8 = (undefined8 *)(in_RDI + (long)local_44 * 0x10);
        uVar2 = *puVar8;
        uVar3 = puVar8[1];
        puVar9 = (undefined8 *)(in_RDI + (long)local_48 * 0x10);
        puVar8 = (undefined8 *)(in_RDI + (long)local_44 * 0x10);
        *puVar8 = *puVar9;
        puVar8[1] = puVar9[1];
        puVar8 = (undefined8 *)(in_RDI + (long)local_48 * 0x10);
        *puVar8 = uVar2;
        puVar8[1] = uVar3;
        local_44 = local_44 + 1;
        local_48 = local_48 + -1;
      }
      if ((uVar13 & 0x1000000) == 0) {
        while( true ) {
          bVar12 = false;
          if (iVar14 < local_48) {
            i._8_8_ = dVar11;
            i.val = (double)pBVar1;
            dVar10 = SPxBoundFlippingRT<double>::BreakpointCompare::operator()
                               (in_RDX,i,*(Breakpoint *)(in_RDI + (long)local_48 * 0x10));
            bVar12 = dVar10 <= 0.0;
          }
          if (!bVar12) break;
          local_48 = local_48 + -1;
        }
        if (local_48 == iVar15) {
          puVar8 = (undefined8 *)(in_RDI + (long)local_48 * 0x10);
          uVar2 = *puVar8;
          uVar3 = puVar8[1];
          puVar9 = (undefined8 *)(in_RDI + (long)iVar5 * 0x10);
          puVar8 = (undefined8 *)(in_RDI + (long)local_48 * 0x10);
          *puVar8 = *puVar9;
          puVar8[1] = puVar9[1];
          puVar8 = (undefined8 *)(in_RDI + (long)iVar5 * 0x10);
          *puVar8 = uVar2;
          puVar8[1] = uVar3;
          local_48 = local_48 + -1;
        }
      }
      else {
        while( true ) {
          bVar12 = false;
          if (local_44 < iVar15) {
            local_d8 = SUB84(dVar11,0);
            in_stack_ffffffffffffff2c = (BreakpointSource)((ulong)dVar11 >> 0x20);
            pauVar7 = (undefined1 (*) [12])(in_RDI + (long)local_44 * 0x10);
            in_stack_ffffffffffffff1c =
                 (BreakpointSource)((ulong)*(undefined8 *)(*pauVar7 + 8) >> 0x20);
            i_00.idx = local_d8;
            i_00.val = (double)pBVar1;
            i_00.src = in_stack_ffffffffffffff2c;
            j.src = in_stack_ffffffffffffff1c;
            j._0_12_ = *pauVar7;
            in_stack_ffffffffffffff20 = pBVar1;
            dVar10 = SPxBoundFlippingRT<double>::BreakpointCompare::operator()(in_RDX,i_00,j);
            bVar12 = 0.0 <= dVar10;
          }
          if (!bVar12) break;
          local_44 = local_44 + 1;
        }
        if (local_44 == iVar14) {
          puVar8 = (undefined8 *)(in_RDI + (long)local_44 * 0x10);
          uVar2 = *puVar8;
          uVar3 = puVar8[1];
          puVar9 = (undefined8 *)(in_RDI + (long)iVar5 * 0x10);
          puVar8 = (undefined8 *)(in_RDI + (long)local_44 * 0x10);
          *puVar8 = *puVar9;
          puVar8[1] = puVar9[1];
          puVar8 = (undefined8 *)(in_RDI + (long)iVar5 * 0x10);
          *puVar8 = uVar2;
          puVar8[1] = uVar3;
          local_44 = local_44 + 1;
        }
      }
      bVar12 = SUB81((ulong)dVar11 >> 0x18,0);
      iVar5 = (int)((ulong)dVar11 >> 0x20);
      end_00 = (int)((ulong)in_RDX >> 0x20);
      if (iVar15 - local_44 < local_48 - iVar14) {
        bVar4 = local_44 < iVar15;
        local_44 = iVar14;
        if (bVar4) {
          SPxQuicksort<soplex::SPxBoundFlippingRT<double>::Breakpoint,soplex::SPxBoundFlippingRT<double>::BreakpointCompare>
                    ((Breakpoint *)CONCAT44(iVar15,in_stack_fffffffffffffff0),end_00,
                     (BreakpointCompare *)CONCAT44(iVar14,uVar13),iVar5,bVar12);
          local_44 = iVar14;
        }
      }
      else {
        bVar4 = iVar14 < local_48;
        local_48 = iVar15;
        if (bVar4) {
          SPxQuicksort<soplex::SPxBoundFlippingRT<double>::Breakpoint,soplex::SPxBoundFlippingRT<double>::BreakpointCompare>
                    ((Breakpoint *)CONCAT44(iVar15,in_stack_fffffffffffffff0),end_00,
                     (BreakpointCompare *)CONCAT44(iVar14,uVar13),iVar5,bVar12);
          local_48 = iVar15;
        }
      }
      uVar13 = uVar13 ^ 0xff000000;
    }
    if (0 < local_48 - local_44) {
      SPxShellsort<soplex::SPxBoundFlippingRT<double>::Breakpoint,soplex::SPxBoundFlippingRT<double>::BreakpointCompare>
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
                 (BreakpointCompare *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
    }
  }
  return;
}

Assistant:

void SPxQuicksort(T* keys, int end, COMPARATOR& compare, int start = 0, bool type = true)
{
   assert(start >= 0);

   /* nothing to sort for less than two elements */
   if(end <= start + 1)
      return;

   /* reduce end position to last element index */
   --end;

   /* use quick-sort for long lists */
   while(end - start >= SOPLEX_SHELLSORTMAX)
   {
      T pivotkey;
      T tmp;
      int lo;
      int hi;
      int mid;

      /* select pivot element */
      mid = start + (end - start) / 2; // Instead of (start + end)/2 because the
      // latter can overflow if start + end >
      // INT_MAX
      pivotkey = keys[mid];

      /* partition the array into elements < pivot [start,hi] and elements >= pivot [lo,end] */
      lo = start;
      hi = end;

      for(;;)
      {
         if(type)
         {
            while(lo < end && compare(keys[lo], pivotkey) < 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) >= 0)
               hi--;
         }
         else
         {
            while(lo < end && compare(keys[lo], pivotkey) <= 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) > 0)
               hi--;
         }

         if(lo >= hi)
            break;

         tmp = keys[lo];
         keys[lo] = keys[hi];
         keys[hi] = tmp;

         lo++;
         hi--;
      }

      assert((hi == lo - 1) || (type && hi == start) || (!type && lo == end));

      /* skip entries which are equal to the pivot element (three partitions, <, =, > than pivot)*/
      if(type)
      {
         while(lo < end && compare(pivotkey, keys[lo]) >= 0)
            lo++;

         /* make sure that we have at least one element in the smaller partition */
         if(lo == start)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[lo];
            keys[lo] = keys[mid];
            keys[mid] = tmp;

            lo++;
         }
      }
      else
      {
         while(hi > start && compare(pivotkey, keys[hi]) <= 0)
            hi--;

         /* make sure that we have at least one element in the smaller partition */
         if(hi == end)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[hi];
            keys[hi] = keys[mid];
            keys[mid] = tmp;

            hi--;
         }
      }

      /* sort the smaller partition by a recursive call, sort the larger part without recursion */
      if(hi - start <= end - lo)
      {
         /* sort [start,hi] with a recursive call */
         if(start < hi)
         {
            SPxQuicksort(keys, hi + 1, compare, start, !type);
         }

         /* now focus on the larger part [lo,end] */
         start = lo;
      }
      else
      {
         if(lo < end)
         {
            SPxQuicksort(keys, end + 1, compare, lo, !type);
         }

         /* now focus on the larger part [start,hi] */
         end = hi;
      }

      type = !type;
   }

   /* use shell sort on the remaining small list */
   if(end - start >= 1)
   {
      SPxShellsort(keys, end, compare, start);
   }


#ifdef CHECK_SORTING

   for(int i = start; i < end; ++i)
      assert(compare(keys[i], keys[i + 1]) <= 0);

#endif
}